

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::fillEventVectorNextIteration(FederateState *this,Time currentTime)

{
  pointer pIVar1;
  pointer puVar2;
  bool bVar3;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  pointer puVar4;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *ept;
  handle local_40;
  
  pIVar1 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((handle *)&local_40,&(this->interfaceInformation).inputs);
  puVar2 = ((local_40.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = ((local_40.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    bVar3 = InputInfo::updateTimeNextIteration
                      ((InputInfo *)
                       (puVar4->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,
                       currentTime);
    if (bVar3) {
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (&this->events,
                 &(((puVar4->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle)
      ;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40.m_handle_lock);
  pIVar1 = (this->eventMessages).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->eventMessages).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&local_40,&(this->interfaceInformation).endpoints);
  puVar2 = ((local_40.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = ((local_40.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    bVar3 = EndpointInfo::updateTimeNextIteration
                      ((puVar4->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,
                       currentTime);
    if (bVar3) {
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (&this->eventMessages,
                 &(((puVar4->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle)
      ;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40.m_handle_lock);
  return;
}

Assistant:

void FederateState::fillEventVectorNextIteration(Time currentTime)
{
    events.clear();
    for (const auto& ipt : interfaceInformation.getInputs()) {
        if (ipt->updateTimeNextIteration(currentTime)) {
            events.push_back(ipt->id.handle);
        }
    }
    eventMessages.clear();
    for (const auto& ept : interfaceInformation.getEndpoints()) {
        if (ept->updateTimeNextIteration(currentTime)) {
            eventMessages.push_back(ept->id.handle);
        }
    }
}